

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_info_key_usage(char **buf,size_t *size,uint key_usage)

{
  int iVar1;
  char *local_40;
  char *sep;
  char *p;
  size_t n;
  int ret;
  uint key_usage_local;
  size_t *size_local;
  char **buf_local;
  
  p = (char *)*size;
  sep = *buf;
  local_40 = anon_var_dwarf_36a810 + 9;
  if ((key_usage & 0x80) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sDigital Signature",anon_var_dwarf_36a810 + 9);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
    local_40 = ", ";
  }
  if ((key_usage & 0x40) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sNon Repudiation",local_40);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
    local_40 = ", ";
  }
  if ((key_usage & 0x20) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sKey Encipherment",local_40);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
    local_40 = ", ";
  }
  if ((key_usage & 0x10) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sData Encipherment",local_40);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
    local_40 = ", ";
  }
  if ((key_usage & 8) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sKey Agreement",local_40);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
    local_40 = ", ";
  }
  if ((key_usage & 4) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sKey Cert Sign",local_40);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
    local_40 = ", ";
  }
  if ((key_usage & 2) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sCRL Sign",local_40);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
    local_40 = ", ";
  }
  if ((key_usage & 1) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sEncipher Only",local_40);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
    local_40 = ", ";
  }
  if ((key_usage & 0x8000) != 0) {
    iVar1 = snprintf(sep,(size_t)p,"%sDecipher Only",local_40);
    if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
      return -0x2980;
    }
    p = p + -(long)iVar1;
    sep = sep + iVar1;
  }
  *size = (size_t)p;
  *buf = sep;
  return 0;
}

Assistant:

int mbedtls_x509_info_key_usage(char **buf, size_t *size,
                                unsigned int key_usage)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t n = *size;
    char *p = *buf;
    const char *sep = "";

    KEY_USAGE(MBEDTLS_X509_KU_DIGITAL_SIGNATURE,    "Digital Signature");
    KEY_USAGE(MBEDTLS_X509_KU_NON_REPUDIATION,      "Non Repudiation");
    KEY_USAGE(MBEDTLS_X509_KU_KEY_ENCIPHERMENT,     "Key Encipherment");
    KEY_USAGE(MBEDTLS_X509_KU_DATA_ENCIPHERMENT,    "Data Encipherment");
    KEY_USAGE(MBEDTLS_X509_KU_KEY_AGREEMENT,        "Key Agreement");
    KEY_USAGE(MBEDTLS_X509_KU_KEY_CERT_SIGN,        "Key Cert Sign");
    KEY_USAGE(MBEDTLS_X509_KU_CRL_SIGN,             "CRL Sign");
    KEY_USAGE(MBEDTLS_X509_KU_ENCIPHER_ONLY,        "Encipher Only");
    KEY_USAGE(MBEDTLS_X509_KU_DECIPHER_ONLY,        "Decipher Only");

    *size = n;
    *buf = p;

    return 0;
}